

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_hour
                 (year_t y,diff_t m,diff_t d,diff_t cd,diff_t hh,minute_t mm,second_t ss)

{
  long lVar1;
  char hh_00;
  fields fVar2;
  
  lVar1 = hh % 0x18;
  hh_00 = (char)lVar1 + '\x18';
  if (-1 < lVar1) {
    hh_00 = (char)lVar1;
  }
  fVar2 = n_mon(y,m,d,cd + (lVar1 >> 0x3f) + hh / 0x18,hh_00,mm,ss);
  fVar2._8_8_ = fVar2._8_8_ & 0xffffffffff;
  return fVar2;
}

Assistant:

CONSTEXPR_F fields n_hour(year_t y, diff_t m, diff_t d, diff_t cd, diff_t hh,
                          minute_t mm, second_t ss) noexcept {
  cd += hh / 24;
  hh %= 24;
  if (hh < 0) {
    cd -= 1;
    hh += 24;
  }
  return n_mon(y, m, d, cd, static_cast<hour_t>(hh), mm, ss);
}